

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QPersistentModelIndex>::moveAppend
          (QGenericArrayOps<QPersistentModelIndex> *this,QPersistentModelIndex *b,
          QPersistentModelIndex *e)

{
  QPersistentModelIndex *pQVar1;
  QPersistentModelIndexData *pQVar2;
  long lVar3;
  
  if (b != e) {
    pQVar1 = (this->super_QArrayDataPointer<QPersistentModelIndex>).ptr;
    lVar3 = (this->super_QArrayDataPointer<QPersistentModelIndex>).size;
    for (; b < e; b = b + 1) {
      pQVar2 = b->d;
      b->d = (QPersistentModelIndexData *)0x0;
      pQVar1[lVar3].d = pQVar2;
      (this->super_QArrayDataPointer<QPersistentModelIndex>).size = lVar3 + 1;
      lVar3 = lVar3 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }